

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::Decode(GroupAssignmentRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32GrpBtField);
    (*(this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_Entity,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16DstCommsDvcID);
    KDataStream::Read(stream,&this->m_ui8DstLineID);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    KDataStream::Read(stream,&this->m_ui8Padding2);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GroupAssignmentRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GROUP_ASSIGNMENT_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32GrpBtField
           >> KDIS_STREAM m_Entity
           >> m_ui16DstCommsDvcID
           >> m_ui8DstLineID
           >> m_ui16Padding1
           >> m_ui8Padding2;
}